

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RC4.cc
# Opt level: O1

ssize_t __thiscall Pl_RC4::write(Pl_RC4 *this,int __fd,void *__buf,size_t __n)

{
  Pipeline *pPVar1;
  int iVar2;
  ssize_t in_RAX;
  undefined4 extraout_var;
  logic_error *this_00;
  undefined4 in_register_00000034;
  void *len;
  uchar *in_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  in_data = (uchar *)CONCAT44(in_register_00000034,__fd);
  if ((this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__buf != (void *)0x0) {
      do {
        len = (void *)this->out_bufsize;
        if (__buf < (void *)this->out_bufsize) {
          len = __buf;
        }
        RC4::process(&this->rc4,in_data,(size_t)len,
                     (this->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        in_data = in_data + (long)len;
        pPVar1 = (this->super_Pipeline).next_;
        iVar2 = (*pPVar1->_vptr_Pipeline[2])
                          (pPVar1,(this->outbuf).
                                  super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,len);
        in_RAX = CONCAT44(extraout_var,iVar2);
        __buf = (void *)((long)__buf - (long)len);
      } while (__buf != (void *)0x0);
    }
    return in_RAX;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,&(this->super_Pipeline).identifier,
                 ": Pl_RC4: write() called after finish() called");
  std::logic_error::logic_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
Pl_RC4::write(unsigned char const* data, size_t len)
{
    if (this->outbuf == nullptr) {
        throw std::logic_error(this->identifier + ": Pl_RC4: write() called after finish() called");
    }

    size_t bytes_left = len;
    unsigned char const* p = data;

    while (bytes_left > 0) {
        size_t bytes = (bytes_left < this->out_bufsize ? bytes_left : out_bufsize);
        bytes_left -= bytes;
        // lgtm[cpp/weak-cryptographic-algorithm]
        rc4.process(p, bytes, outbuf.get());
        p += bytes;
        next()->write(outbuf.get(), bytes);
    }
}